

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)53,_(unsigned_short)22>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  puVar2 = *in;
  uVar1 = *puVar2;
  out[0x16] = (ulong)(uVar1 >> 0xe);
  *in = puVar2 + 1;
  uVar3 = (ulong)puVar2[1] << 0x12 | (ulong)(uVar1 >> 0xe);
  out[0x16] = uVar3;
  *in = puVar2 + 2;
  uVar1 = puVar2[2];
  out[0x16] = (ulong)(uVar1 & 7) << 0x32 | uVar3;
  uVar3 = (ulong)(uVar1 >> 3);
  out[0x17] = uVar3;
  *in = puVar2 + 3;
  out[0x17] = (ulong)(puVar2[3] & 0xffffff) << 0x1d | uVar3;
  Unroller<(unsigned_short)53,_(unsigned_short)24>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}